

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::write_significand<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,char *significand,
          int significand_size,int integral_size,char decimal_point)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *this;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_48;
  buffer<char> *local_40;
  buffer<char> *local_38;
  char local_29;
  int local_28;
  int iStack_24;
  char decimal_point_local;
  int integral_size_local;
  int significand_size_local;
  char *significand_local;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_local;
  
  local_40 = out.container;
  local_29 = decimal_point;
  local_28 = integral_size;
  iStack_24 = significand_size;
  _integral_size_local = significand;
  significand_local = (char *)out.container;
  local_38 = (buffer<char> *)
             copy_str<char,_const_char_*,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_0>
                       (significand,significand + integral_size,out);
  out_local = (back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_38;
  if (local_29 != '\0') {
    significand_local = (char *)local_38;
    local_48 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator++
                         ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)&significand_local
                          ,0);
    this = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_48);
    std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=(this,&local_29);
    out_local = copy_str<char,_const_char_*,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_0>
                          (_integral_size_local + local_28,_integral_size_local + iStack_24,
                           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)significand_local);
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_local.container;
}

Assistant:

inline OutputIt write_significand(OutputIt out, const char* significand,
                                  int significand_size, int integral_size,
                                  Char decimal_point) {
  out = detail::copy_str<Char>(significand, significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str<Char>(significand + integral_size,
                                significand + significand_size, out);
}